

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

void __thiscall QHttpNetworkReplyPrivate::~QHttpNetworkReplyPrivate(QHttpNetworkReplyPrivate *this)

{
  ~QHttpNetworkReplyPrivate(this);
  operator_delete(this,0x1d0);
  return;
}

Assistant:

QHttpNetworkReplyPrivate::~QHttpNetworkReplyPrivate() = default;